

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTestResult.cpp
# Opt level: O0

void __thiscall UnitTest::DeferredTestResult::DeferredTestResult(DeferredTestResult *this)

{
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11;
  DeferredTestResult *local_10;
  DeferredTestResult *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->testName,"",local_25);
  std::allocator<char>::~allocator(local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->failureFile,"",&local_26);
  std::allocator<char>::~allocator(&local_26);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->failures);
  this->timeElapsed = 0.0;
  this->failed = false;
  return;
}

Assistant:

DeferredTestResult::DeferredTestResult()
	: suiteName("")
	, testName("")
	, failureFile("")
	, timeElapsed(0.0f)
	, failed(false)
{
}